

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ram_test.cc
# Opt level: O0

int main(void)

{
  test_activate_service();
  test_add_user_to_group();
  test_attach_policy_to_group();
  test_attach_policy_to_role();
  test_attach_policy_to_user();
  test_bind_mf_adevice();
  test_clear_account_alias();
  test_create_access_key();
  test_create_group();
  test_create_login_profile();
  test_create_policy();
  test_create_policy_version();
  test_create_role();
  test_create_user();
  test_create_virtual_mf_adevice();
  test_deactivate_service();
  test_delete_access_key();
  test_delete_group();
  test_delete_login_profile();
  test_delete_policy();
  test_delete_policy_version();
  test_delete_role();
  test_delete_user();
  test_delete_virtual_mf_adevice();
  test_detach_policy_from_group();
  test_detach_policy_from_role();
  test_detach_policy_from_user();
  test_get_account_alias();
  test_get_account_summary();
  test_get_group();
  test_get_login_profile();
  test_get_password_policy();
  test_get_policy();
  test_get_policy_version();
  test_get_role();
  test_get_security_preference();
  test_get_service_status();
  test_get_user();
  test_get_user_mf_ainfo();
  test_list_access_keys();
  test_list_entities_for_policy();
  test_list_groups();
  test_list_groups_for_user();
  test_list_policies();
  test_list_policies_for_group();
  test_list_policies_for_role();
  test_list_policies_for_user();
  test_list_policy_versions();
  test_list_roles();
  test_list_users();
  test_list_users_for_group();
  test_list_virtual_mf_adevices();
  test_remove_user_from_group();
  test_set_account_alias();
  test_set_default_policy_version();
  test_set_password_policy();
  test_set_security_preference();
  test_unbind_mf_adevice();
  test_update_access_key();
  test_update_group();
  test_update_login_profile();
  test_update_role();
  test_update_user();
  return 0;
}

Assistant:

int main() {
  test_activate_service();
  test_add_user_to_group();
  test_attach_policy_to_group();
  test_attach_policy_to_role();
  test_attach_policy_to_user();
  test_bind_mf_adevice();
  test_clear_account_alias();
  test_create_access_key();
  test_create_group();
  test_create_login_profile();
  test_create_policy();
  test_create_policy_version();
  test_create_role();
  test_create_user();
  test_create_virtual_mf_adevice();
  test_deactivate_service();
  test_delete_access_key();
  test_delete_group();
  test_delete_login_profile();
  test_delete_policy();
  test_delete_policy_version();
  test_delete_role();
  test_delete_user();
  test_delete_virtual_mf_adevice();
  test_detach_policy_from_group();
  test_detach_policy_from_role();
  test_detach_policy_from_user();
  test_get_account_alias();
  test_get_account_summary();
  test_get_group();
  test_get_login_profile();
  test_get_password_policy();
  test_get_policy();
  test_get_policy_version();
  test_get_role();
  test_get_security_preference();
  test_get_service_status();
  test_get_user();
  test_get_user_mf_ainfo();
  test_list_access_keys();
  test_list_entities_for_policy();
  test_list_groups();
  test_list_groups_for_user();
  test_list_policies();
  test_list_policies_for_group();
  test_list_policies_for_role();
  test_list_policies_for_user();
  test_list_policy_versions();
  test_list_roles();
  test_list_users();
  test_list_users_for_group();
  test_list_virtual_mf_adevices();
  test_remove_user_from_group();
  test_set_account_alias();
  test_set_default_policy_version();
  test_set_password_policy();
  test_set_security_preference();
  test_unbind_mf_adevice();
  test_update_access_key();
  test_update_group();
  test_update_login_profile();
  test_update_role();
  test_update_user();
}